

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O0

void __thiscall
JobManagerTestSuite::SetInitialExpectations(JobManagerTestSuite *this,TestContext *aContext)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  CommissionerAppStaticExpecter *this_00;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_01;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar4;
  element_type *peVar5;
  char *in_R9;
  AssertHelper local_188;
  Message local_180;
  Status local_172;
  Status local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  ReturnAction<ot::commissioner::Error> local_138;
  anon_class_8_1_e02df38c_for_action local_128;
  anon_class_8_1_e02df38c_for_action local_120;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:110:40),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_118;
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_100;
  WithoutMatchers local_d9;
  Matcher<const_ot::commissioner::Config_&> local_d8;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_c0;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_a8;
  uint local_6c;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  TestContext *aContext_local;
  JobManagerTestSuite *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )aContext;
  testing::AssertionResult::
  AssertionResult<std::shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson>>
            ((AssertionResult *)local_28,&aContext->mPS,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)"aContext.mPS","false","true",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  local_6c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (local_6c == 0) {
    this_00 = (CommissionerAppStaticExpecter *)
              ((long)gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 0x378);
    testing::internal::AnythingMatcher::operator_cast_to_Matcher
              (&local_c0,(AnythingMatcher *)&testing::_);
    testing::internal::AnythingMatcher::operator_cast_to_Matcher
              (&local_d8,(AnythingMatcher *)&testing::_);
    CommissionerAppStaticExpecter::gmock_Create(&local_a8,this_00,&local_c0,&local_d8);
    testing::internal::GetWithoutMatchers();
    this_01 = testing::internal::
              MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::operator()(&local_a8,&local_d9,(void *)0x0);
    pcVar3 = "aContext.mCommissionerAppStaticExpecter";
    pTVar4 = testing::internal::
             MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
             ::InternalExpectedAt
                       (this_01,
                        "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                        ,0x6c,"aContext.mCommissionerAppStaticExpecter","Create(_, _)");
    pTVar4 = testing::internal::
             TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
             ::Times(pTVar4,1);
    local_128.aContext =
         (TestContext *)
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_120.aContext =
         (TestContext *)
         testing::
         WithArg<0ul,JobManagerTestSuite::SetInitialExpectations(JobManagerTestSuite::TestContext&)::_lambda(std::shared_ptr<ot::commissioner::CommissionerApp>&)_1_>
                   (&local_128);
    ot::commissioner::Error::Error((Error *)&gtest_ar.message_);
    testing::Return<ot::commissioner::Error>((testing *)&local_138,(Error *)&gtest_ar.message_);
    testing::
    DoAll<testing::internal::WithArgsAction<JobManagerTestSuite::SetInitialExpectations(JobManagerTestSuite::TestContext&)::_lambda(std::shared_ptr<ot::commissioner::CommissionerApp>&)_1_,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
              (&local_118,(testing *)&local_120,
               (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:110:40),_0UL>
                *)&local_138,(ReturnAction<ot::commissioner::Error> *)pcVar3);
    testing::internal::DoAllAction::operator_cast_to_Action(&local_100,(DoAllAction *)&local_118);
    testing::internal::
    TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::WillOnce(pTVar4,&local_100);
    testing::
    Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::~Action(&local_100);
    testing::internal::
    DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:110:40),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
    ::~DoAllAction(&local_118);
    testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_138);
    ot::commissioner::Error::~Error((Error *)&gtest_ar.message_);
    testing::internal::
    MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
    ::~MockSpec(&local_a8);
    testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_d8);
    testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher(&local_c0);
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    iVar2 = (*(peVar5->super_PersistentStorage)._vptr_PersistentStorage[2])();
    local_171 = (Status)iVar2;
    local_172 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
              ((EqHelper *)local_170,"aContext.mPS->Open()",
               "persistent_storage::PersistentStorage::Status::kSuccess",&local_171,&local_172);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                (&local_188,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x71,pcVar3);
      testing::internal::AssertHelper::operator=(&local_188,&local_180);
      testing::internal::AssertHelper::~AssertHelper(&local_188);
      testing::Message::~Message(&local_180);
    }
    local_6c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  }
  return;
}

Assistant:

void SetInitialExpectations(TestContext &aContext)
    {
        ASSERT_TRUE(aContext.mPS);
        EXPECT_CALL(aContext.mCommissionerAppStaticExpecter, Create(_, _))
            .Times(1)
            .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = aContext.mDefaultCommissioner; }),
                            Return(Error{})));

        ASSERT_EQ(aContext.mPS->Open(), persistent_storage::PersistentStorage::Status::kSuccess);
    }